

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraRtInterface.cpp
# Opt level: O2

HRESULT ChakraRTInterface::ParseConfigFlags(void)

{
  code *pcVar1;
  HRESULT HVar2;
  BSTR in_RAX;
  PAL_FILE *pPVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  BSTR local_18;
  char16 *fileNameWide;
  
  local_18 = in_RAX;
  if ((m_testHooks.pfSetAssertToConsoleFlag != (SetAssertToConsoleFlagPtr)0x0) && (m_testHooksSetup)
     ) {
    (*m_testHooks.pfSetAssertToConsoleFlag)(true);
  }
  if ((m_testHooks.pfSetConfigFlags != (SetConfigFlagsPtr)0x0) &&
     ((m_testHooksSetup != true ||
      (HVar2 = (*m_testHooks.pfSetConfigFlags)
                         (m_argInfo->argc,m_argInfo->argv,
                          &HostConfigFlags::flags.super_ICustomConfigFlags), HVar2 != 0)))) {
    if (m_usageStringPrinted != false) {
      return 0;
    }
    (*m_argInfo->hostPrintUsage)();
    m_usageStringPrinted = true;
    return 0;
  }
  m_argInfo->filename = (char *)0x0;
  if (m_testHooks.pfGetFilenameFlag != (_func_HRESULT_BSTR_ptr *)0x0) {
    local_18 = (LPCWSTR)0x0;
    if ((m_testHooksSetup == true) &&
       (HVar2 = (*m_testHooks.pfGetFilenameFlag)(&local_18), HVar2 == 0)) {
      HVar2 = utf8::WideStringToNarrowDynamic(local_18,&m_argInfo->filename);
      SysFreeString(local_18);
      if (HVar2 < 0) {
        if (HVar2 == -0x7ff8fff2) {
          PAL_wprintf(L"Error: Ran out of memory");
          return -0x7ff8fff2;
        }
        pPVar3 = PAL_get_stderr(0);
        pcVar5 = "hr == ((HRESULT)0x8007000EL)";
        pcVar6 = "hr == E_OUTOFMEMORY";
        uVar4 = 0x118;
        goto LAB_0010a3c4;
      }
    }
    else {
      PAL_wprintf(L"Error: no script file specified.");
      (*m_argInfo->hostPrintUsage)();
      m_usageStringPrinted = true;
    }
    return 0;
  }
  pPVar3 = PAL_get_stderr(0);
  pcVar5 = "m_testHooks.pfGetFilenameFlag != nullptr";
  uVar4 = 0x107;
  pcVar6 = "m_testHooks.pfGetFilenameFlag != nullptr";
LAB_0010a3c4:
  PAL_fprintf(pPVar3,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ChakraRtInterface.cpp"
              ,uVar4,pcVar5,pcVar6);
  pPVar3 = PAL_get_stderr(0);
  PAL_fflush(pPVar3);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

HRESULT ChakraRTInterface::ParseConfigFlags()
{
    HRESULT hr = S_OK;

    if (m_testHooks.pfSetAssertToConsoleFlag)
    {
        SetAssertToConsoleFlag(true);
    }

    if (m_testHooks.pfSetConfigFlags)
    {
        hr = SetConfigFlags(m_argInfo->argc, m_argInfo->argv, &HostConfigFlags::flags);
        if (hr != S_OK && !m_usageStringPrinted)
        {
            m_argInfo->hostPrintUsage();
            m_usageStringPrinted = true;
        }
    }

    if (hr == S_OK)
    {
        m_argInfo->filename = nullptr;
        Assert(m_testHooks.pfGetFilenameFlag != nullptr);

        char16* fileNameWide = nullptr;
        hr = GetFileNameFlag(&fileNameWide);

        if (hr != S_OK)
        {
            wprintf(_u("Error: no script file specified."));
            m_argInfo->hostPrintUsage();
            m_usageStringPrinted = true;
        }
        else
        {
            hr = WideStringToNarrowDynamic(fileNameWide, &m_argInfo->filename);
            SysFreeString(fileNameWide);
            if (FAILED(hr))
            {
                Assert(hr == E_OUTOFMEMORY);
                wprintf(_u("Error: Ran out of memory"));
                return hr;
            }
        }
    }

    return S_OK;
}